

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpu_data.h
# Opt level: O0

void __thiscall dlib::gpu_data::set_size(gpu_data *this,size_t new_size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  __shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  ulong *in_RDI;
  
  if (in_RSI == (__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *in_RDI = 0;
    *(undefined1 *)(in_RDI + 1) = 1;
    *(undefined1 *)((long)in_RDI + 9) = 1;
    *(undefined1 *)((long)in_RDI + 0xb) = 0;
    std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)0x0);
    std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::reset(in_RSI);
  }
  else if (in_RSI != (__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)*in_RDI) {
    *in_RDI = (ulong)in_RSI;
    *(undefined1 *)(in_RDI + 1) = 1;
    *(undefined1 *)((long)in_RDI + 9) = 1;
    *(undefined1 *)((long)in_RDI + 0xb) = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::reset<float,std::default_delete<float[]>>
              ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 2),pvVar3);
    std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::reset(in_RSI);
  }
  return;
}

Assistant:

void set_size(size_t new_size)
        {
            if (new_size == 0)
            {
                data_size = 0;
                host_current = true;
                device_current = true;
                device_in_use = false;
                data_host.reset();
                data_device.reset();
            }
            else if (new_size != data_size)
            {
                data_size = new_size;
                host_current = true;
                device_current = true;
                device_in_use = false;
                data_host.reset(new float[new_size], std::default_delete<float[]>());
                data_device.reset();
            }
        }